

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O1

EStatusCode __thiscall
AbstractContentContext::DrawImage
          (AbstractContentContext *this,double inX,double inY,string *inImagePath,
          ImageOptions *inOptions)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 in_R9;
  double dVar2;
  double dVar3;
  double dVar4;
  ObjectIDTypeAndBool OVar5;
  DoubleAndDoublePair DVar6;
  undefined8 uVar7;
  double local_68;
  double local_60;
  double local_58;
  string local_40;
  
  if (inOptions->transformationMethod == eMatrix) {
    dVar3 = inOptions->matrix[5];
    dVar4 = inOptions->matrix[4];
    local_58 = inOptions->matrix[3];
    local_68 = inOptions->matrix[2];
    dVar2 = inOptions->matrix[0];
    local_60 = inOptions->matrix[1];
  }
  else {
    if (inOptions->transformationMethod == eFit) {
      DVar6 = PDFHummus::DocumentContext::GetImageDimensions
                        (this->mDocumentContext,inImagePath,inOptions->imageIndex,
                         &inOptions->pdfParsingOptions);
      dVar2 = DVar6.second;
      dVar3 = inOptions->boundingBoxWidth;
      local_58 = inOptions->boundingBoxHeight;
      dVar4 = DVar6.first;
      if (inOptions->fitPolicy == eAlways) {
        dVar3 = dVar3 / dVar4;
        local_58 = local_58 / dVar2;
      }
      else if ((dVar3 < dVar4) || (local_58 < dVar2)) {
        dVar3 = (double)(~-(ulong)(dVar3 < dVar4) & 0x3ff0000000000000 |
                        (ulong)(dVar3 / dVar4) & -(ulong)(dVar3 < dVar4));
        local_58 = (double)(~-(ulong)(local_58 < dVar2) & 0x3ff0000000000000 |
                           (ulong)(local_58 / dVar2) & -(ulong)(local_58 < dVar2));
      }
      else {
        dVar3 = 1.0;
        local_58 = 1.0;
      }
      dVar2 = dVar3;
      if ((inOptions->fitProportional != false) && (dVar2 = local_58, dVar3 <= local_58)) {
        dVar2 = dVar3;
        local_58 = dVar3;
      }
    }
    else {
      local_58 = 1.0;
      dVar2 = 1.0;
    }
    local_60 = 0.0;
    local_68 = 0.0;
    dVar4 = 0.0;
    dVar3 = 0.0;
  }
  uVar7 = 0;
  OVar5 = PDFHummus::DocumentContext::RegisterImageForDrawing
                    (this->mDocumentContext,inImagePath,inOptions->imageIndex);
  if (((undefined1  [16])OVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (*this->_vptr_AbstractContentContext[3])
              (this,inImagePath,inOptions->imageIndex,OVar5.first,&inOptions->pdfParsingOptions,
               in_R9,dVar2,uVar7);
  }
  q(this);
  cm(this,dVar2,local_60,local_68,local_58,dVar4 + inX,dVar3 + inY);
  iVar1 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
            (&local_40,(ResourcesDictionary *)CONCAT44(extraout_var,iVar1),OVar5.first);
  Do(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  Q(this);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::DrawImage(double inX,double inY,const std::string& inImagePath,const ImageOptions& inOptions)
{
	double transformation[6] = {1,0,0,1,0,0};

	if(inOptions.transformationMethod == eMatrix)
	{
		for(int i=0;i<6;++i)
			transformation[i] = inOptions.matrix[i];
	}
	else if(inOptions.transformationMethod == eFit)
	{
		DoubleAndDoublePair imageDimensions = mDocumentContext->GetImageDimensions(inImagePath,inOptions.imageIndex,inOptions.pdfParsingOptions);

        double scaleX = 1;
        double scaleY = 1;
                    
        if(inOptions.fitPolicy == eAlways)
        {
            scaleX = inOptions.boundingBoxWidth / imageDimensions.first;
            scaleY = inOptions.boundingBoxHeight / imageDimensions.second;
                        

        }
        else if(imageDimensions.first > inOptions.boundingBoxWidth || imageDimensions.second > inOptions.boundingBoxHeight) // overflow
        {
            scaleX = imageDimensions.first > inOptions.boundingBoxWidth ? inOptions.boundingBoxWidth / imageDimensions.first : 1;
            scaleY = imageDimensions.second > inOptions.boundingBoxHeight ? inOptions.boundingBoxHeight / imageDimensions.second : 1;
        }
                    
        if(inOptions.fitProportional)
        {
            scaleX = std::min(scaleX,scaleY);
            scaleY = scaleX;
        }
                    
        transformation[0] = scaleX;
        transformation[3] = scaleY;
	}

	transformation[4]+=inX;
	transformation[5]+=inY;

    // registering the images at pdfwriter to allow optimization on image writes
    ObjectIDTypeAndBool result = mDocumentContext->RegisterImageForDrawing(inImagePath,inOptions.imageIndex);
    if(result.second)
    {
        // if first usage, write the image
        ScheduleImageWrite(inImagePath,inOptions.imageIndex,result.first,inOptions.pdfParsingOptions);
    }
    
    q();
    cm(transformation[0],transformation[1],transformation[2],transformation[3],transformation[4],transformation[5]);
    Do(GetResourcesDictionary()->AddFormXObjectMapping(result.first));
    Q();
	return GetCurrentStatusCode();

}